

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O1

void __thiscall rtosc::MidiMappernRT::snoop_bToU(MidiMappernRT *this,char *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int ID;
  int ID_00;
  undefined4 uVar2;
  undefined4 uVar3;
  _Tuple_impl<2UL,_int,_rtosc::MidiBijection> *p_Var4;
  int iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  char *__s;
  uint uVar8;
  float fVar9;
  rtosc_arg_t rVar10;
  string args;
  allocator<char> local_79;
  key_type local_78;
  float local_54;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,msg,&local_79);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                  *)this,&local_78);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar6._M_node == &(this->inv_map)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,msg,&local_79);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
           ::operator[](&this->inv_map,&local_78);
  ID = (pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
       super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
       super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.super__Head_base<2UL,_int,_false>.
       _M_head_impl;
  ID_00 = (pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
          super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.super__Head_base<1UL,_int,_false>.
          _M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,msg,(allocator<char> *)&local_78);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
           ::operator[](&this->inv_map,&local_50);
  p_Var4 = &(pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
            super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
            super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>;
  uVar2 = (p_Var4->super__Tuple_impl<3UL,_rtosc::MidiBijection>).
          super__Head_base<3UL,_rtosc::MidiBijection,_false>._M_head_impl.mode;
  uVar3 = (p_Var4->super__Tuple_impl<3UL,_rtosc::MidiBijection>).
          super__Head_base<3UL,_rtosc::MidiBijection,_false>._M_head_impl.min;
  local_54 = (pmVar7->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
             super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
             super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.
             super__Tuple_impl<3UL,_rtosc::MidiBijection>.
             super__Head_base<3UL,_rtosc::MidiBijection,_false>._M_head_impl.max;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __s = rtosc_argument_string(msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
  iVar5 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar5 == 0) {
    rVar10 = rtosc_argument(msg,0);
    fVar9 = rVar10.f;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar5 == 0) {
      rVar10 = rtosc_argument(msg,0);
      fVar9 = (float)rVar10.i;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar5 == 0) {
        fVar9 = 1.0;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar5 != 0) goto LAB_00113564;
        fVar9 = 0.0;
      }
    }
  }
  uVar8 = 0;
  if (uVar2 == 0) {
    uVar8 = (uint)(((fVar9 - (float)uVar3) / (local_54 - (float)uVar3)) * 16384.0);
  }
  if (ID_00 != -1) {
    apply_midi(this,(int)uVar8 >> 7,ID_00);
  }
  if (ID != -1) {
    apply_midi(this,uVar8 & 0x7f,ID);
  }
LAB_00113564:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MidiMappernRT::snoop_bToU(const char *msg)
{

    if(inv_map.find(msg) != inv_map.end())
    {
        auto apple = inv_map[msg];
        MidiBijection bi = getBijection(msg);
        float value = 0;
        std::string args = rtosc_argument_string(msg);
        if(args == "f")
            value = rtosc_argument(msg, 0).f;
        else if(args == "i")
            value = rtosc_argument(msg, 0).i;
        else if(args == "T")
            value = 1.0;
        else if(args == "F")
            value = 0.0;
        else
            return;

        int new_midi = bi(value);
        if(std::get<1>(apple) != -1)
            apply_high(new_midi,std::get<1>(apple));
        if(std::get<2>(apple) != -1)
            apply_low(new_midi,std::get<2>(apple));
    }
}